

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Profile.cpp
# Opt level: O2

void __thiscall Profile::__displayBacktraceDynMap(Profile *this)

{
  bool bVar1;
  ostream *poVar2;
  __node_base *p_Var3;
  shared_ptr<DynFuncCall> value;
  __shared_ptr<DynFuncCall,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  if (DebugFlag) {
    bVar1 = isCurrentDebugType("info");
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"__displayBacktraceDynMap");
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x116);
      std::endl<char,std::char_traits<char>>(poVar2);
    }
  }
  p_Var3 = &(this->__backtraceDynamicMap)._M_h._M_before_begin;
  while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
    std::__shared_ptr<DynFuncCall,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,(__shared_ptr<DynFuncCall,_(__gnu_cxx::_Lock_policy)2> *)(p_Var3 + 2));
    if (DebugFlag == true) {
      bVar1 = isCurrentDebugType("info");
      if (bVar1) {
        poVar2 = operator<<((ostream *)&std::cerr,local_40._M_ptr);
        std::endl<char,std::char_traits<char>>(poVar2);
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  }
  return;
}

Assistant:

void Profile::__displayBacktraceDynMap(){
    DEBUG("info",cerr << __FUNCTION__ << ":" << __LINE__<< endl;);
    for (auto it = __backtraceDynamicMap.begin(); it != __backtraceDynamicMap.end(); it++){
        shared_ptr<DynFuncCall>value = it->second;
        DEBUG("info",cerr << *value << endl;);
    }
}